

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O1

void redrawSystem(int n)

{
  ulong uVar1;
  ulong uVar2;
  int unaff_EBP;
  undefined4 in_register_0000003c;
  long lVar3;
  long lVar4;
  
  clear(CONCAT44(in_register_0000003c,n));
  refresh();
  if (grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data._M_finish
      != grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    uVar2 = 0;
    do {
      box(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar2].w_main,0,0);
      box(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar2].w_code,0,0);
      box(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar2].w_divider,0,0);
      wrefresh(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar2].w_main);
      wrefresh(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar2].w_reg);
      wrefresh(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar2].w_code);
      wrefresh(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar2].w_divider);
      if (unaff_EBP < 4) {
        lVar4 = (long)unaff_EBP;
        lVar3 = uVar2 * 0x15 + lVar4 + 0x11;
        do {
          lVar4 = lVar4 + 1;
          if (*(long *)(&(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                          super__Vector_impl_data._M_start)->nodeId + lVar3 * 8) != 0) {
            wrefresh(*(undefined8 *)
                      (*(long *)(&(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                                   super__Vector_impl_data._M_start)->nodeId + lVar3 * 8) + 0x18));
          }
          lVar3 = lVar3 + 1;
        } while ((int)lVar4 != 4);
        unaff_EBP = 4;
      }
      uVar2 = (ulong)((int)uVar2 + 1);
      uVar1 = ((long)grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x30c30c30c30c30c3;
    } while (uVar2 <= uVar1 && uVar1 - uVar2 != 0);
  }
  drawSystemContent();
  refresh();
  return;
}

Assistant:

void redrawSystem(int n){
  clear();
  refresh();
  for(unsigned int i=0;i<grid.size();i++){
      box(grid[i].w_main,0,0);
      box(grid[i].w_code,0,0);
      box(grid[i].w_divider,0,0);
      wrefresh(grid[i].w_main);
      wrefresh(grid[i].w_reg);
      wrefresh(grid[i].w_code);
      wrefresh(grid[i].w_divider);
      for(int j;j<4;j++){
	if(grid[i].arrows[j])
	  wrefresh(grid[i].arrows[j]->win);
      }
  }
  drawSystemContent();
  refresh();
  return;
}